

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_add(nghttp2_bufs *bufs,void *data,size_t len)

{
  nghttp2_buf_chain *pnVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t local_50;
  void *local_48;
  uint8_t *p;
  nghttp2_buf *buf;
  size_t nwrite;
  size_t sStack_28;
  int rv;
  size_t len_local;
  void *data_local;
  nghttp2_bufs *bufs_local;
  
  local_48 = data;
  sStack_28 = len;
  do {
    while( true ) {
      if (sStack_28 == 0) {
        return 0;
      }
      pnVar1 = bufs->cur;
      if ((ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last) < sStack_28) {
        local_50 = (long)(pnVar1->buf).end - (long)(pnVar1->buf).last;
      }
      else {
        local_50 = sStack_28;
      }
      if (local_50 == 0) break;
      puVar3 = nghttp2_cpymem((pnVar1->buf).last,local_48,local_50);
      (pnVar1->buf).last = puVar3;
      local_48 = (void *)(local_50 + (long)local_48);
      sStack_28 = sStack_28 - local_50;
    }
    iVar2 = bufs_alloc_chain(bufs);
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

int nghttp2_bufs_add(nghttp2_bufs *bufs, const void *data, size_t len) {
  int rv;
  size_t nwrite;
  nghttp2_buf *buf;
  const uint8_t *p;

  p = data;

  while (len) {
    buf = &bufs->cur->buf;

    nwrite = nghttp2_min(nghttp2_buf_avail(buf), len);
    if (nwrite == 0) {
      rv = bufs_alloc_chain(bufs);
      if (rv != 0) {
        return rv;
      }
      continue;
    }

    buf->last = nghttp2_cpymem(buf->last, p, nwrite);
    p += nwrite;
    len -= nwrite;
  }

  return 0;
}